

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall TcpServerImpl::~TcpServerImpl(TcpServerImpl *this)

{
  bool bVar1;
  TcpServerImpl *this_local;
  
  (this->super_BaseSocketImpl)._vptr_BaseSocketImpl = (_func_int **)&PTR__TcpServerImpl_001b9468;
  std::function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)>::operator=
            (&this->m_fNewConnection,(nullptr_t)0x0);
  (this->super_BaseSocketImpl).m_bStop = true;
  bVar1 = std::thread::joinable(&(this->super_BaseSocketImpl).m_thListen);
  if (bVar1) {
    std::thread::join();
  }
  Delete(this);
  std::function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&,_void_*)>::
  ~function(&this->m_fNewConnectionParam);
  std::function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)>::~function
            (&this->m_fNewConnection);
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_vSock);
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_vSockAccept);
  BaseSocketImpl::~BaseSocketImpl(&this->super_BaseSocketImpl);
  return;
}

Assistant:

TcpServerImpl::~TcpServerImpl()
{
    m_fNewConnection = nullptr;
    m_bStop = true; // Stops the listening thread

    if (m_thListen.joinable() == true)
        m_thListen.join();
    Delete();
}